

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

bool __thiscall cmCacheManager::SaveCache(cmCacheManager *this,string *path,cmMessenger *messenger)

{
  char cVar1;
  CacheIterator i_00;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  ostream *poVar6;
  string *psVar7;
  CacheEntry *this_00;
  CacheIterator CVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  undefined1 local_7d0 [8];
  ofstream checkCache;
  string checkCacheFile;
  string local_5a8;
  string local_588;
  allocator<char> local_561;
  string local_560;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  char *local_4d0;
  char *help_1;
  cmCacheManager *pcStack_4c0;
  CacheEntryType local_4ac;
  undefined1 auStack_4a8 [4];
  CacheEntryType t_1;
  CacheIterator i_1;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  char *local_420;
  char *help;
  string *psStack_410;
  CacheEntryType t;
  CacheEntry *ce;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>
  *i;
  iterator __end1;
  iterator __begin1;
  CacheEntryMap *__range1;
  string local_3e0;
  undefined1 local_3c0 [8];
  string currentcwd;
  allocator<char> local_379;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  undefined4 local_2c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  undefined1 local_2a0 [8];
  cmGeneratedFileStream fout;
  undefined1 local_48 [8];
  string cacheFile;
  cmMessenger *messenger_local;
  string *path_local;
  cmCacheManager *this_local;
  
  cacheFile.field_2._8_8_ = messenger;
  std::__cxx11::string::string((string *)local_48,(string *)path);
  std::__cxx11::string::operator+=((string *)local_48,"/CMakeCache.txt");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2a0,(string *)local_48,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_2a0,true);
  bVar2 = std::ios::operator!((ios *)(local_2a0 + (long)*(_func_int **)((long)local_2a0 + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"CMAKE_CACHE_MAJOR_VERSION",&local_2e9);
    uVar4 = cmVersion::GetMajorVersion();
    std::__cxx11::to_string(&local_310,uVar4);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    AddCacheEntry(this,&local_2e8,pcVar5,
                  "Major version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,"CMAKE_CACHE_MINOR_VERSION",&local_331);
    uVar4 = cmVersion::GetMinorVersion();
    std::__cxx11::to_string(&local_358,uVar4);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    AddCacheEntry(this,&local_330,pcVar5,
                  "Minor version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_330);
    std::allocator<char>::~allocator(&local_331);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"CMAKE_CACHE_PATCH_VERSION",&local_379);
    uVar4 = cmVersion::GetPatchVersion();
    std::__cxx11::to_string((string *)((long)&currentcwd.field_2 + 8),uVar4);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    AddCacheEntry(this,&local_378,pcVar5,
                  "Patch version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)(currentcwd.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator(&local_379);
    std::__cxx11::string::string((string *)local_3c0,(string *)path);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_3c0);
    if ((('@' < *pcVar5) &&
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_3c0), *pcVar5 < '[')) &&
       (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_3c0), *pcVar5 == ':')) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_3c0);
      cVar1 = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_3c0);
      *pcVar5 = cVar1 + ' ';
    }
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_3c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"CMAKE_CACHEFILE_DIR",(allocator<char> *)((long)&__range1 + 7));
    pcVar5 = (char *)std::__cxx11::string::c_str();
    AddCacheEntry(this,&local_3e0,pcVar5,
                  "This is the directory where this CMakeCache.txt was created",INTERNAL);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    poVar6 = std::operator<<((ostream *)local_2a0,"# This is the CMakeCache file.\n");
    poVar6 = std::operator<<(poVar6,"# For build in directory: ");
    poVar6 = std::operator<<(poVar6,(string *)local_3c0);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"# It was generated by CMake: ");
    psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)local_2a0,
                             "# You can edit this file to change values found and used by cmake.");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,
                             "# If you do not want to change any of the values, simply exit the editor."
                            );
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,
                             "# If you do want to change a value, simply edit, save, and exit the editor."
                            );
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,"# The syntax for the file is as follows:\n");
    poVar6 = std::operator<<(poVar6,"# KEY:TYPE=VALUE\n");
    poVar6 = std::operator<<(poVar6,"# KEY is the name of a variable in the cache.\n");
    poVar6 = std::operator<<(poVar6,
                             "# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT TYPE!.");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar6,"# VALUE is the current value for the KEY.\n\n");
    std::operator<<((ostream *)local_2a0,"########################\n");
    std::operator<<((ostream *)local_2a0,"# EXTERNAL cache entries\n");
    std::operator<<((ostream *)local_2a0,"########################\n");
    std::operator<<((ostream *)local_2a0,"\n");
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
             ::begin(&this->Cache);
    i = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
           ::end(&this->Cache);
    while (bVar3 = std::operator!=(&__end1,(_Self *)&i), bVar3) {
      ce = (CacheEntry *)
           std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
           ::operator*(&__end1);
      this_00 = &((reference)ce)->second;
      help._4_4_ = (((reference)ce)->second).Type;
      psStack_410 = &this_00->Value;
      if ((((((reference)ce)->second).Initialized & 1U) != 0) && (help._4_4_ != INTERNAL)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_440,"HELPSTRING",&local_441);
        pcVar5 = CacheEntry::GetProperty(this_00,&local_440);
        std::__cxx11::string::~string((string *)&local_440);
        std::allocator<char>::~allocator(&local_441);
        local_420 = pcVar5;
        if (pcVar5 == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_490,"Missing description",
                     (allocator<char> *)((long)&i_1.Position._M_node + 7));
          OutputHelpString((ostream *)local_2a0,&local_490);
          std::__cxx11::string::~string((string *)&local_490);
          std::allocator<char>::~allocator((allocator<char> *)((long)&i_1.Position._M_node + 7));
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,pcVar5,&local_469)
          ;
          OutputHelpString((ostream *)local_2a0,&local_468);
          std::__cxx11::string::~string((string *)&local_468);
          std::allocator<char>::~allocator(&local_469);
        }
        OutputKey((ostream *)local_2a0,&ce->Value);
        poVar6 = std::operator<<((ostream *)local_2a0,":");
        pcVar5 = cmState::CacheEntryTypeToString(help._4_4_);
        poVar6 = std::operator<<(poVar6,pcVar5);
        std::operator<<(poVar6,"=");
        OutputValue((ostream *)local_2a0,psStack_410);
        std::operator<<((ostream *)local_2a0,"\n");
        OutputNewlineTruncationWarning
                  ((ostream *)local_2a0,&ce->Value,psStack_410,
                   (cmMessenger *)cacheFile.field_2._8_8_);
        std::operator<<((ostream *)local_2a0,"\n");
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
      ::operator++(&__end1);
    }
    std::operator<<((ostream *)local_2a0,"\n");
    std::operator<<((ostream *)local_2a0,"########################\n");
    std::operator<<((ostream *)local_2a0,"# INTERNAL cache entries\n");
    std::operator<<((ostream *)local_2a0,"########################\n");
    std::operator<<((ostream *)local_2a0,"\n");
    CVar8 = NewIterator(this);
    while( true ) {
      i_1.Container = (cmCacheManager *)CVar8.Position._M_node;
      _auStack_4a8 = CVar8.Container;
      bVar3 = CacheIterator::IsAtEnd((CacheIterator *)auStack_4a8);
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      bVar3 = CacheIterator::Initialized((CacheIterator *)auStack_4a8);
      if (bVar3) {
        local_4ac = CacheIterator::GetType((CacheIterator *)auStack_4a8);
        help_1 = (char *)_auStack_4a8;
        pcStack_4c0 = i_1.Container;
        i_00.Position._M_node = (_Base_ptr)i_1.Container;
        i_00.Container = _auStack_4a8;
        WritePropertyEntries(this,(ostream *)local_2a0,i_00,(cmMessenger *)cacheFile.field_2._8_8_);
        if (local_4ac == INTERNAL) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4f0,"HELPSTRING",&local_4f1);
          pcVar5 = CacheIterator::GetProperty((CacheIterator *)auStack_4a8,&local_4f0);
          std::__cxx11::string::~string((string *)&local_4f0);
          std::allocator<char>::~allocator(&local_4f1);
          local_4d0 = pcVar5;
          if (pcVar5 != (char *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_518,pcVar5,&local_519);
            OutputHelpString((ostream *)local_2a0,&local_518);
            std::__cxx11::string::~string((string *)&local_518);
            std::allocator<char>::~allocator(&local_519);
          }
          CacheIterator::GetName_abi_cxx11_(&local_540,(CacheIterator *)auStack_4a8);
          OutputKey((ostream *)local_2a0,&local_540);
          std::__cxx11::string::~string((string *)&local_540);
          poVar6 = std::operator<<((ostream *)local_2a0,":");
          pcVar5 = cmState::CacheEntryTypeToString(local_4ac);
          poVar6 = std::operator<<(poVar6,pcVar5);
          std::operator<<(poVar6,"=");
          pcVar5 = CacheIterator::GetValue((CacheIterator *)auStack_4a8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,pcVar5,&local_561)
          ;
          OutputValue((ostream *)local_2a0,&local_560);
          std::__cxx11::string::~string((string *)&local_560);
          std::allocator<char>::~allocator(&local_561);
          std::operator<<((ostream *)local_2a0,"\n");
          CacheIterator::GetName_abi_cxx11_(&local_588,(CacheIterator *)auStack_4a8);
          pcVar5 = CacheIterator::GetValue((CacheIterator *)auStack_4a8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5a8,pcVar5,
                     (allocator<char> *)(checkCacheFile.field_2._M_local_buf + 0xf));
          OutputNewlineTruncationWarning
                    ((ostream *)local_2a0,&local_588,&local_5a8,
                     (cmMessenger *)cacheFile.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(checkCacheFile.field_2._M_local_buf + 0xf));
          std::__cxx11::string::~string((string *)&local_588);
        }
      }
      CacheIterator::Next((CacheIterator *)auStack_4a8);
      CVar8.Position._M_node = (_Base_ptr)i_1.Container;
      CVar8.Container = _auStack_4a8;
    }
    std::operator<<((ostream *)local_2a0,"\n");
    cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_2a0);
    std::__cxx11::string::string((string *)&checkCache.field_0x1f8,(string *)path);
    std::__cxx11::string::operator+=((string *)&checkCache.field_0x1f8,"/CMakeFiles");
    cmsys::SystemTools::MakeDirectory((string *)&checkCache.field_0x1f8,(mode_t *)0x0);
    std::__cxx11::string::operator+=((string *)&checkCache.field_0x1f8,"/cmake.check_cache");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_7d0,pcVar5,_S_out);
    bVar2 = std::ios::operator!((ios *)(local_7d0 + (long)*(_func_int **)((long)local_7d0 + -0x18)))
    ;
    bVar3 = (bVar2 & 1) != 0;
    if (bVar3) {
      std::operator+(&local_7f0,"Unable to open check cache file for write. ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &checkCache.field_0x1f8);
      cmSystemTools::Error(&local_7f0);
      std::__cxx11::string::~string((string *)&local_7f0);
    }
    else {
      std::operator<<((ostream *)local_7d0,
                      "# This file is generated by cmake for dependency checking of the CMakeCache.txt file\n"
                     );
    }
    this_local._7_1_ = !bVar3;
    local_2c4 = 1;
    std::ofstream::~ofstream(local_7d0);
    std::__cxx11::string::~string((string *)&checkCache.field_0x1f8);
    std::__cxx11::string::~string((string *)local_3c0);
  }
  else {
    std::operator+(&local_2c0,"Unable to open cache file for save. ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    cmSystemTools::Error(&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    cmSystemTools::ReportLastSystemError("");
    this_local._7_1_ = false;
    local_2c4 = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2a0);
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmCacheManager::SaveCache(const std::string& path, cmMessenger* messenger)
{
  std::string cacheFile = path;
  cacheFile += "/CMakeCache.txt";
  cmGeneratedFileStream fout(cacheFile);
  fout.SetCopyIfDifferent(true);
  if (!fout) {
    cmSystemTools::Error("Unable to open cache file for save. " + cacheFile);
    cmSystemTools::ReportLastSystemError("");
    return false;
  }
  // before writing the cache, update the version numbers
  // to the
  this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION",
                      std::to_string(cmVersion::GetMajorVersion()).c_str(),
                      "Major version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);
  this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION",
                      std::to_string(cmVersion::GetMinorVersion()).c_str(),
                      "Minor version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);
  this->AddCacheEntry("CMAKE_CACHE_PATCH_VERSION",
                      std::to_string(cmVersion::GetPatchVersion()).c_str(),
                      "Patch version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);

  // Let us store the current working directory so that if somebody
  // Copies it, he will not be surprised
  std::string currentcwd = path;
  if (currentcwd[0] >= 'A' && currentcwd[0] <= 'Z' && currentcwd[1] == ':') {
    // Cast added to avoid compiler warning. Cast is ok because
    // value is guaranteed to fit in char by the above if...
    currentcwd[0] = static_cast<char>(currentcwd[0] - 'A' + 'a');
  }
  cmSystemTools::ConvertToUnixSlashes(currentcwd);
  this->AddCacheEntry("CMAKE_CACHEFILE_DIR", currentcwd.c_str(),
                      "This is the directory where this CMakeCache.txt"
                      " was created",
                      cmStateEnums::INTERNAL);

  /* clang-format off */
  fout << "# This is the CMakeCache file.\n"
       << "# For build in directory: " << currentcwd << "\n"
       << "# It was generated by CMake: "
       << cmSystemTools::GetCMakeCommand() << std::endl;
  /* clang-format on */

  /* clang-format off */
  fout << "# You can edit this file to change values found and used by cmake."
       << std::endl
       << "# If you do not want to change any of the values, simply exit the "
       "editor." << std::endl
       << "# If you do want to change a value, simply edit, save, and exit "
       "the editor." << std::endl
       << "# The syntax for the file is as follows:\n"
       << "# KEY:TYPE=VALUE\n"
       << "# KEY is the name of a variable in the cache.\n"
       << "# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT "
       "TYPE!." << std::endl
       << "# VALUE is the current value for the KEY.\n\n";
  /* clang-format on */

  fout << "########################\n";
  fout << "# EXTERNAL cache entries\n";
  fout << "########################\n";
  fout << "\n";

  for (auto const& i : this->Cache) {
    CacheEntry const& ce = i.second;
    cmStateEnums::CacheEntryType t = ce.Type;
    if (!ce.Initialized) {
      /*
        // This should be added in, but is not for now.
      cmSystemTools::Error("Cache entry \"" + i.first + "\" is uninitialized");
      */
    } else if (t != cmStateEnums::INTERNAL) {
      // Format is key:type=value
      if (const char* help = ce.GetProperty("HELPSTRING")) {
        cmCacheManager::OutputHelpString(fout, help);
      } else {
        cmCacheManager::OutputHelpString(fout, "Missing description");
      }
      cmCacheManager::OutputKey(fout, i.first);
      fout << ":" << cmState::CacheEntryTypeToString(t) << "=";
      cmCacheManager::OutputValue(fout, ce.Value);
      fout << "\n";
      cmCacheManager::OutputNewlineTruncationWarning(fout, i.first, ce.Value,
                                                     messenger);
      fout << "\n";
    }
  }

  fout << "\n";
  fout << "########################\n";
  fout << "# INTERNAL cache entries\n";
  fout << "########################\n";
  fout << "\n";

  for (cmCacheManager::CacheIterator i = this->NewIterator(); !i.IsAtEnd();
       i.Next()) {
    if (!i.Initialized()) {
      continue;
    }

    cmStateEnums::CacheEntryType t = i.GetType();
    this->WritePropertyEntries(fout, i, messenger);
    if (t == cmStateEnums::INTERNAL) {
      // Format is key:type=value
      if (const char* help = i.GetProperty("HELPSTRING")) {
        cmCacheManager::OutputHelpString(fout, help);
      }
      cmCacheManager::OutputKey(fout, i.GetName());
      fout << ":" << cmState::CacheEntryTypeToString(t) << "=";
      cmCacheManager::OutputValue(fout, i.GetValue());
      fout << "\n";
      cmCacheManager::OutputNewlineTruncationWarning(fout, i.GetName(),
                                                     i.GetValue(), messenger);
    }
  }
  fout << "\n";
  fout.Close();
  std::string checkCacheFile = path;
  checkCacheFile += "/CMakeFiles";
  cmSystemTools::MakeDirectory(checkCacheFile);
  checkCacheFile += "/cmake.check_cache";
  cmsys::ofstream checkCache(checkCacheFile.c_str());
  if (!checkCache) {
    cmSystemTools::Error("Unable to open check cache file for write. " +
                         checkCacheFile);
    return false;
  }
  checkCache << "# This file is generated by cmake for dependency checking "
                "of the CMakeCache.txt file\n";
  return true;
}